

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_LDREXD_a32(DisasContext_conflict1 *s,arg_LDREX *a)

{
  int iVar1;
  arg_LDREX *a_local;
  DisasContext_conflict1 *s_local;
  
  iVar1 = arm_dc_feature(s,4);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else if ((a->rt & 1U) == 0) {
    a->rt2 = a->rt + 1;
    s_local._7_1_ = op_ldrex(s,a,MO_64,false);
  }
  else {
    unallocated_encoding_aarch64(s);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_LDREXD_a32(DisasContext *s, arg_LDREX *a)
{
    if (!ENABLE_ARCH_6K) {
        return false;
    }
    /* We UNDEF for these UNPREDICTABLE cases.  */
    if (a->rt & 1) {
        unallocated_encoding(s);
        return true;
    }
    a->rt2 = a->rt + 1;
    return op_ldrex(s, a, MO_64, false);
}